

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void btreeblk_init(btreeblk_handle *handle,filemgr *file,uint32_t nodesize)

{
  uint uVar1;
  btreeblk_subblocks *pbVar2;
  uint8_t *__s;
  size_t __size;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __size_00;
  uint8_t **ppuVar6;
  
  handle->file = file;
  handle->nodesize = nodesize;
  __size = 0;
  handle->nnodeperblock = (uint16_t)(file->blocksize / nodesize);
  (handle->blockpool).head = (list_elem *)0x0;
  (handle->blockpool).tail = (list_elem *)0x0;
  handle->nlivenodes = 0;
  handle->ndeltanodes = 0;
  (handle->alc_list).head = (list_elem *)0x0;
  (handle->alc_list).tail = (list_elem *)0x0;
  (handle->read_list).head = (list_elem *)0x0;
  (handle->read_list).tail = (list_elem *)0x0;
  handle->dirty_update = (filemgr_dirty_update_node *)0x0;
  handle->dirty_update_writer = (filemgr_dirty_update_node *)0x0;
  uVar1 = 0x80;
  for (uVar4 = 0; (uVar3 = (uint)uVar4, uVar1 < nodesize && (uVar3 < 5)); uVar4 = uVar4 + 1) {
    uVar1 = uVar1 * 2;
    __size = __size + 0x18;
  }
  handle->nsb = uVar3;
  if (uVar3 == 0) {
    handle->sb = (btreeblk_subblocks *)0x0;
  }
  else {
    pbVar2 = (btreeblk_subblocks *)malloc(__size);
    handle->sb = pbVar2;
    ppuVar6 = &pbVar2->bitmap;
    uVar1 = 0x80;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      ((btreeblk_subblocks *)(ppuVar6 + -2))->bid = 0xffffffffffffffff;
      *(uint *)(ppuVar6 + -1) = uVar1;
      *(uint16_t *)((long)ppuVar6 + -4) = (uint16_t)((ulong)nodesize / (ulong)uVar1);
      __size_00 = (ulong)nodesize / (ulong)uVar1 & 0xffff;
      __s = (uint8_t *)malloc(__size_00);
      *ppuVar6 = __s;
      memset(__s,0,__size_00);
      uVar1 = uVar1 * 2;
      ppuVar6 = ppuVar6 + 3;
    }
  }
  return;
}

Assistant:

void btreeblk_init(struct btreeblk_handle *handle, struct filemgr *file,
                   uint32_t nodesize)
{
    uint32_t i;
    uint32_t _nodesize;

    handle->file = file;
    handle->nodesize = nodesize;
    handle->nnodeperblock = handle->file->blocksize / handle->nodesize;
    handle->nlivenodes = 0;
    handle->ndeltanodes = 0;
    handle->dirty_update = NULL;
    handle->dirty_update_writer = NULL;

    list_init(&handle->alc_list);
    list_init(&handle->read_list);

#ifdef __BTREEBLK_BLOCKPOOL
    list_init(&handle->blockpool);
#endif

    // compute # subblock sets
    _nodesize = BTREEBLK_MIN_SUBBLOCK;
    for (i=0; (_nodesize < nodesize && i<5); ++i){
        _nodesize = _nodesize << 1;
    }
    handle->nsb = i;
    if (handle->nsb) {
        handle->sb = (struct btreeblk_subblocks*)
                     malloc(sizeof(struct btreeblk_subblocks) * handle->nsb);
        // initialize each subblock set
        _nodesize = BTREEBLK_MIN_SUBBLOCK;
        for (i=0;i<handle->nsb;++i){
            handle->sb[i].bid = BLK_NOT_FOUND;
            handle->sb[i].sb_size = _nodesize;
            handle->sb[i].nblocks = nodesize / _nodesize;
            handle->sb[i].bitmap = (uint8_t*)malloc(handle->sb[i].nblocks);
            memset(handle->sb[i].bitmap, 0, handle->sb[i].nblocks);
            _nodesize = _nodesize << 1;
        }
    } else {
        handle->sb = NULL;
    }
}